

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_check_wildcard(char *cn,mbedtls_x509_buf *name)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  size_t sVar7;
  
  sVar4 = strlen(cn);
  uVar2 = name->len;
  iVar6 = 0;
  if (((2 < uVar2) && (puVar3 = name->p, *puVar3 == '*')) && (puVar3[1] == '.')) {
    if (sVar4 != 0) {
      sVar7 = 0;
      do {
        if (cn[sVar7] == '.') goto LAB_00123cc0;
        sVar7 = sVar7 + 1;
      } while (sVar4 != sVar7);
    }
    sVar7 = 0;
LAB_00123cc0:
    if ((sVar7 == 0) || (sVar4 - sVar7 != uVar2 - 1)) {
LAB_00123d07:
      iVar6 = -1;
    }
    else if (uVar2 == 1) {
      iVar6 = 0;
    }
    else {
      lVar5 = 0;
      do {
        bVar1 = puVar3[lVar5 + 1];
        if ((bVar1 != cn[lVar5 + sVar7]) &&
           (((byte)(cn[lVar5 + sVar7] ^ bVar1) != 0x20 || (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)))))
        goto LAB_00123d07;
        lVar5 = lVar5 + 1;
        iVar6 = 0;
      } while (uVar2 - 1 != lVar5);
    }
  }
  return iVar6;
}

Assistant:

static int x509_check_wildcard( const char *cn, mbedtls_x509_buf *name )
{
    size_t i;
    size_t cn_idx = 0, cn_len = strlen( cn );

    if( name->len < 3 || name->p[0] != '*' || name->p[1] != '.' )
        return( 0 );

    for( i = 0; i < cn_len; ++i )
    {
        if( cn[i] == '.' )
        {
            cn_idx = i;
            break;
        }
    }

    if( cn_idx == 0 )
        return( -1 );

    if( cn_len - cn_idx == name->len - 1 &&
        x509_memcasecmp( name->p + 1, cn + cn_idx, name->len - 1 ) == 0 )
    {
        return( 0 );
    }

    return( -1 );
}